

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O1

int envy_bios_parse_mem_train_ptrn(envy_bios *bios)

{
  byte *pbVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  envy_bios_mem_train_ptrn_entry *peVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  
  uVar2 = (bios->mem).train_ptrn.offset;
  iVar3 = 0;
  if (uVar2 != 0) {
    if ((uint)uVar2 < bios->length) {
      (bios->mem).train_ptrn.version = bios->data[(uint)uVar2];
      iVar13 = 0;
    }
    else {
      (bios->mem).train_ptrn.version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar13 = -0xe;
    }
    lVar9 = (ulong)(bios->mem).train_ptrn.offset + 1;
    if ((uint)lVar9 < bios->length) {
      (bios->mem).train_ptrn.hlen = bios->data[lVar9];
      iVar11 = 0;
    }
    else {
      (bios->mem).train_ptrn.hlen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar11 = -0xe;
    }
    lVar9 = (ulong)(bios->mem).train_ptrn.offset + 2;
    if ((uint)lVar9 < bios->length) {
      (bios->mem).train_ptrn.rlen = bios->data[lVar9];
      iVar4 = 0;
    }
    else {
      (bios->mem).train_ptrn.rlen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar4 = -0xe;
    }
    lVar9 = (ulong)(bios->mem).train_ptrn.offset + 3;
    if ((uint)lVar9 < bios->length) {
      (bios->mem).train_ptrn.subentrylen = bios->data[lVar9];
      iVar5 = 0;
    }
    else {
      (bios->mem).train_ptrn.subentrylen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar5 = -0xe;
    }
    lVar9 = (ulong)(bios->mem).train_ptrn.offset + 4;
    if ((uint)lVar9 < bios->length) {
      (bios->mem).train_ptrn.entriesnum = bios->data[lVar9];
      iVar8 = 0;
    }
    else {
      (bios->mem).train_ptrn.entriesnum = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar8 = -0xe;
    }
    (bios->mem).train_ptrn.subentries = '\x01';
    iVar3 = -0xe;
    if ((((iVar11 == 0 && iVar13 == 0) && iVar4 == 0) && iVar5 == 0) && iVar8 == 0) {
      envy_bios_block(bios,(uint)(bios->mem).train_ptrn.offset,
                      (uint)(bios->mem).train_ptrn.entriesnum * (uint)(bios->mem).train_ptrn.rlen +
                      (uint)(bios->mem).train_ptrn.hlen,"MEM TRAIN PATTERN",-1);
      peVar7 = (envy_bios_mem_train_ptrn_entry *)calloc((ulong)(bios->mem).train_ptrn.entriesnum,6);
      (bios->mem).train_ptrn.entries = peVar7;
      if (peVar7 == (envy_bios_mem_train_ptrn_entry *)0x0) {
        iVar3 = -0xc;
      }
      else {
        if ((bios->mem).train_ptrn.entriesnum != '\0') {
          lVar9 = 5;
          uVar12 = 0;
          do {
            peVar7 = (bios->mem).train_ptrn.entries;
            uVar6 = (int)uVar12 *
                    ((uint)(bios->mem).train_ptrn.subentrylen *
                     (uint)(bios->mem).train_ptrn.subentries + (uint)(bios->mem).train_ptrn.rlen) +
                    (uint)(bios->mem).train_ptrn.hlen + (uint)(bios->mem).train_ptrn.offset;
            *(short *)((long)peVar7 + lVar9 + -5) = (short)uVar6;
            uVar6 = uVar6 & 0xffff;
            if (uVar6 < bios->length) {
              *(uint8_t *)((long)peVar7 + lVar9 + -3) = bios->data[uVar6];
            }
            else {
              *(undefined1 *)((long)peVar7 + lVar9 + -3) = 0;
              fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
            }
            pbVar1 = (byte *)((long)peVar7 + lVar9 + -3);
            *pbVar1 = *pbVar1 & 0x3f;
            lVar10 = (ulong)*(ushort *)((long)peVar7 + lVar9 + -5) + 1;
            if ((uint)lVar10 < bios->length) {
              *(uint8_t *)((long)peVar7 + lVar9 + -2) = bios->data[lVar10];
            }
            else {
              *(undefined1 *)((long)peVar7 + lVar9 + -2) = 0;
              fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
            }
            if ((bios->mem).train_ptrn.rlen < 4) {
              *(undefined1 *)((long)peVar7 + lVar9 + -1) = 0;
              *(char *)((long)&peVar7->offset + lVar9) = (char)uVar12;
            }
            else {
              lVar10 = (ulong)*(ushort *)((long)peVar7 + lVar9 + -5) + 2;
              if ((uint)lVar10 < bios->length) {
                *(uint8_t *)((long)peVar7 + lVar9 + -1) = bios->data[lVar10];
              }
              else {
                *(undefined1 *)((long)peVar7 + lVar9 + -1) = 0;
                fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
              }
              *(bool *)((long)peVar7 + lVar9 + -1) = (*(byte *)((long)peVar7 + lVar9 + -1) & 7) == 2
              ;
              lVar10 = (ulong)*(ushort *)((long)peVar7 + lVar9 + -5) + 3;
              if ((uint)lVar10 < bios->length) {
                *(uint8_t *)((long)&peVar7->offset + lVar9) = bios->data[lVar10];
              }
              else {
                *(undefined1 *)((long)&peVar7->offset + lVar9) = 0;
                fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
              }
            }
            uVar12 = uVar12 + 1;
            lVar9 = lVar9 + 6;
          } while (uVar12 < (bios->mem).train_ptrn.entriesnum);
        }
        (bios->mem).train_ptrn.valid = '\x01';
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int
envy_bios_parse_mem_train_ptrn(struct envy_bios *bios) {
	struct envy_bios_mem_train_ptrn *mtp = &bios->mem.train_ptrn;
	if (!mtp->offset)
		return 0;
	int err = 0;
	err |= bios_u8(bios, mtp->offset, &mtp->version);
	err |= bios_u8(bios, mtp->offset+1, &mtp->hlen);
	err |= bios_u8(bios, mtp->offset+2, &mtp->rlen);
	err |= bios_u8(bios, mtp->offset+3, &mtp->subentrylen);
	err |= bios_u8(bios, mtp->offset+4, &mtp->entriesnum);
	mtp->subentries = 1;
	if (err)
		return -EFAULT;

	envy_bios_block(bios, mtp->offset,
			mtp->hlen + mtp->rlen * mtp->entriesnum,
			"MEM TRAIN PATTERN", -1);

	mtp->entries = calloc(mtp->entriesnum, sizeof *mtp->entries);
	if (!mtp->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < mtp->entriesnum; i++) {
		struct envy_bios_mem_train_ptrn_entry *entry = &mtp->entries[i];
		entry->offset = mtp->offset + mtp->hlen +
				((mtp->rlen + mtp->subentries * mtp->subentrylen) * i);
		err |= bios_u8(bios, entry->offset, &entry->bits);
		entry->bits &= 0x3f;
		err |= bios_u8(bios, entry->offset+1, &entry->modulo);
		if (mtp->rlen >= 4) {
			err |= bios_u8(bios, entry->offset+2, &entry->indirect);
			entry->indirect = (entry->indirect & 0x7) == 0x2;
			err |= bios_u8(bios, entry->offset+3, &entry->indirect_entry);
		} else {
			entry->indirect = 0;
			entry->indirect_entry = i;
		}
	}
	mtp->valid = 1;
	return 0;
}